

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O0

bool __thiscall
QHttpHeaders::replaceOrAppend(QHttpHeaders *this,QAnyStringView name,QAnyStringView newValue)

{
  long lVar1;
  QAnyStringView value;
  QAnyStringView value_00;
  QAnyStringView name_00;
  QAnyStringView name_01;
  QAnyStringView value_01;
  QAnyStringView name_02;
  bool bVar2;
  QByteArray *in_RCX;
  Self *in_RSI;
  QHttpHeaders *in_RDI;
  HeaderName *in_R8;
  long in_FS_OFFSET;
  HeaderName *in_stack_ffffffffffffff18;
  bool local_c1;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_ffffffffffffff50;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_ffffffffffffff58;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isEmpty((QHttpHeaders *)0x1c75f0);
  if (bVar2) {
    name_02.m_size = in_stack_ffffffffffffff90;
    name_02.field_0.m_data = in_stack_ffffffffffffff88.m_data;
    value_01.m_size = in_stack_ffffffffffffff80;
    value_01.field_0.m_data = in_stack_ffffffffffffff78.m_data;
    local_c1 = append(in_RDI,name_02,value_01);
  }
  else {
    name_01.m_size = in_stack_ffffffffffffff68;
    name_01.field_0.m_data = in_stack_ffffffffffffff60.m_data;
    bVar2 = isValidHttpHeaderNameField(name_01);
    if ((bVar2) &&
       (value.m_size = in_stack_ffffffffffffff48,
       value.field_0.m_data = in_stack_ffffffffffffff40.m_data,
       bVar2 = isValidHttpHeaderValueField(value), bVar2)) {
      name_00.m_size = (size_t)in_stack_ffffffffffffff60.m_data;
      name_00.field_0.m_data = in_stack_ffffffffffffff58.m_data;
      HeaderName::HeaderName(in_stack_ffffffffffffff18,name_00);
      value_00.m_size = (size_t)in_stack_ffffffffffffff58.m_data;
      value_00.field_0.m_data = in_stack_ffffffffffffff50.m_data;
      normalizedValue(value_00);
      QHttpHeadersPrivate::replaceOrAppend(in_RSI,in_R8,in_RCX);
      QByteArray::~QByteArray((QByteArray *)0x1c7751);
      HeaderName::~HeaderName((HeaderName *)0x1c775e);
      local_c1 = true;
    }
    else {
      local_c1 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_c1;
}

Assistant:

bool QHttpHeaders::replaceOrAppend(QAnyStringView name, QAnyStringView newValue)
{
    if (isEmpty())
        return append(name, newValue);

    if (!isValidHttpHeaderNameField(name) || !isValidHttpHeaderValueField(newValue))
        return false;

    QHttpHeadersPrivate::replaceOrAppend(d, HeaderName{name}, normalizedValue(newValue));
    return true;
}